

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

path * boost::filesystem::detail::weakly_canonical
                 (path *__return_storage_ptr__,path *p,error_code *ec)

{
  path *this;
  bool bVar1;
  type tVar2;
  file_type fVar3;
  int error_num;
  reference p_00;
  pointer ppVar4;
  ulong uVar5;
  string_type *psVar6;
  char *pcVar7;
  long lVar8;
  bool local_131;
  path local_130;
  path local_110;
  iterator local_f0;
  byte local_b9;
  undefined4 local_b8;
  bool tail_has_dots;
  file_status head_status;
  undefined1 local_a0 [8];
  iterator itr;
  error_code tmp_ec;
  path tail;
  path head;
  error_code *ec_local;
  path *p_local;
  
  filesystem::path::path((path *)((long)&tail.m_pathname.field_2 + 8),p);
  filesystem::path::path((path *)&tmp_ec.m_cat);
  system::error_code::error_code((error_code *)&itr.m_pos);
  filesystem::path::end((iterator *)local_a0,p);
  while (bVar1 = filesystem::path::empty((path *)((long)&tail.m_pathname.field_2 + 8)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    filesystem::status((filesystem *)&stack0xffffffffffffff4c,
                       (path *)((long)&tail.m_pathname.field_2 + 8),(error_code *)&itr.m_pos);
    fVar3 = file_status::type((file_status *)&stack0xffffffffffffff4c);
    bVar1 = anon_unknown.dwarf_522f::error
                      ((uint)(fVar3 == status_error),(path *)((long)&tail.m_pathname.field_2 + 8),ec
                       ,"boost::filesystem::weakly_canonical");
    if (bVar1) {
      filesystem::path::path(__return_storage_ptr__);
      goto LAB_00114cf5;
    }
    fVar3 = file_status::type((file_status *)&stack0xffffffffffffff4c);
    if (fVar3 != file_not_found) break;
    filesystem::path::remove_filename((path *)((long)&tail.m_pathname.field_2 + 8));
    iterators::detail::
    iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_true,_false>
    ::operator--((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_true,_false>
                  *)local_a0);
  }
  local_b9 = 0;
  do {
    filesystem::path::end(&local_f0,p);
    tVar2 = iterators::operator!=
                      ((iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                        *)local_a0,
                       (iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                        *)&local_f0);
    filesystem::path::iterator::~iterator(&local_f0);
    if (!tVar2) {
      bVar1 = filesystem::path::empty((path *)((long)&tail.m_pathname.field_2 + 8));
      if (bVar1) {
        filesystem::path::lexically_normal(__return_storage_ptr__,p);
      }
      else {
        filesystem::canonical
                  (&local_110,(path *)((long)&tail.m_pathname.field_2 + 8),(error_code *)&itr.m_pos)
        ;
        this = (path *)((long)&tail.m_pathname.field_2 + 8);
        filesystem::path::operator=(this,&local_110);
        filesystem::path::~path(&local_110);
        error_num = system::error_code::value((error_code *)&itr.m_pos);
        bVar1 = anon_unknown.dwarf_522f::error
                          (error_num,this,ec,"boost::filesystem::weakly_canonical");
        if (bVar1) {
          filesystem::path::path(__return_storage_ptr__);
        }
        else {
          bVar1 = filesystem::path::empty((path *)&tmp_ec.m_cat);
          local_131 = false;
          if (bVar1) {
            filesystem::path::path
                      (__return_storage_ptr__,(path *)((long)&tail.m_pathname.field_2 + 8));
          }
          else {
            local_131 = (local_b9 & 1) == 0;
            if (local_131) {
              operator/(__return_storage_ptr__,(path *)((long)&tail.m_pathname.field_2 + 8),
                        (path *)&tmp_ec.m_cat);
            }
            else {
              operator/(&local_130,(path *)((long)&tail.m_pathname.field_2 + 8),
                        (path *)&tmp_ec.m_cat);
              filesystem::path::lexically_normal(__return_storage_ptr__,&local_130);
            }
            local_131 = !local_131;
          }
          if (local_131) {
            filesystem::path::~path(&local_130);
          }
        }
      }
LAB_00114cf5:
      local_b8 = 1;
      filesystem::path::iterator::~iterator((iterator *)local_a0);
      filesystem::path::~path((path *)&tmp_ec.m_cat);
      filesystem::path::~path((path *)((long)&tail.m_pathname.field_2 + 8));
      return __return_storage_ptr__;
    }
    p_00 = iterators::detail::
           iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
           ::operator*((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                        *)local_a0);
    filesystem::path::operator/=((path *)&tmp_ec.m_cat,p_00);
    ppVar4 = iterators::detail::
             iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
             ::operator->((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                           *)local_a0);
    filesystem::path::native_abi_cxx11_(ppVar4);
    uVar5 = std::__cxx11::string::size();
    if (uVar5 < 3) {
      ppVar4 = iterators::detail::
               iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
               ::operator->((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                             *)local_a0);
      psVar6 = filesystem::path::native_abi_cxx11_(ppVar4);
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)psVar6);
      if (*pcVar7 == '.') {
        ppVar4 = iterators::detail::
                 iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                 ::operator->((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                               *)local_a0);
        filesystem::path::native_abi_cxx11_(ppVar4);
        lVar8 = std::__cxx11::string::size();
        if (lVar8 != 1) {
          ppVar4 = iterators::detail::
                   iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                   ::operator->((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                                 *)local_a0);
          psVar6 = filesystem::path::native_abi_cxx11_(ppVar4);
          pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)psVar6);
          if (*pcVar7 != '.') goto LAB_00114b50;
        }
        local_b9 = 1;
      }
    }
LAB_00114b50:
    iterators::detail::
    iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                  *)local_a0);
  } while( true );
}

Assistant:

BOOST_FILESYSTEM_DECL
  path weakly_canonical(const path& p, system::error_code* ec)
  {
    path head(p);
    path tail;
    system::error_code tmp_ec;
    path::iterator itr = p.end();

    for (; !head.empty(); --itr)
    {
      file_status head_status = status(head, tmp_ec);
      if (error(head_status.type() == fs::status_error,
        head, ec, "boost::filesystem::weakly_canonical"))
        return path();
      if (head_status.type() != fs::file_not_found)
        break;
      head.remove_filename();
    }

    bool tail_has_dots = false;
    for (; itr != p.end(); ++itr)
    { 
      tail /= *itr;
      // for a later optimization, track if any dot or dot-dot elements are present
      if (itr->native().size() <= 2
        && itr->native()[0] == dot
        && (itr->native().size() == 1 || itr->native()[1] == dot))
        tail_has_dots = true;
    }
    
    if (head.empty())
      return p.lexically_normal();
    head = canonical(head, tmp_ec);
    if (error(tmp_ec.value(), head, ec, "boost::filesystem::weakly_canonical"))
      return path();
    return tail.empty()
      ? head
      : (tail_has_dots  // optimization: only normalize if tail had dot or dot-dot element
          ? (head/tail).lexically_normal()  
          : head/tail);
  }